

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThanEquals,false,true,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  int64_t *piVar4;
  sel_t sVar5;
  int64_t lmonths;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  idx_t iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int64_t ldays;
  int64_t lmicros;
  interval_t *input;
  
  if (count + 0x3f < 0x40) {
    iVar13 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar13 = 0;
    uVar8 = 0;
    uVar9 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar6 = count;
        }
LAB_00446e4f:
        uVar12 = uVar9;
        if (uVar9 < uVar6) {
          lVar10 = rdata->micros;
          psVar2 = sel->sel_vector;
          lVar15 = (long)rdata->days + lVar10 / 86400000000;
          lVar11 = lVar15 % 0x1e;
          lVar15 = (long)rdata->months + lVar15 / 0x1e;
          psVar3 = true_sel->sel_vector;
          piVar4 = &ldata[uVar9].micros;
          do {
            uVar7 = uVar9;
            if (psVar2 != (sel_t *)0x0) {
              uVar7 = (ulong)psVar2[uVar9];
            }
            lVar14 = (long)*(int32_t *)((long)piVar4 + -4) + *piVar4 / 86400000000;
            lVar16 = lVar14 % 0x1e;
            lVar14 = (long)((interval_t *)(piVar4 + -1))->months + lVar14 / 0x1e;
            if (lVar14 < lVar15) {
LAB_00446f58:
              uVar12 = 0;
            }
            else {
              uVar12 = 1;
              if (lVar14 <= lVar15) {
                if (lVar16 < lVar11) goto LAB_00446f58;
                uVar12 = (ulong)(lVar10 % 86400000000 <= *piVar4 % 86400000000 || lVar11 < lVar16);
              }
            }
            psVar3[iVar13] = (sel_t)uVar7;
            iVar13 = uVar12 + iVar13;
            uVar9 = uVar9 + 1;
            piVar4 = piVar4 + 2;
            uVar12 = uVar6;
          } while (uVar6 != uVar9);
        }
      }
      else {
        uVar7 = puVar1[uVar8];
        uVar6 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar6 = count;
        }
        uVar12 = uVar6;
        if (uVar7 != 0) {
          if (uVar7 == 0xffffffffffffffff) goto LAB_00446e4f;
          uVar12 = uVar9;
          if (uVar9 < uVar6) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            piVar4 = &ldata[uVar9].micros;
            uVar17 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar5 = (int)uVar9 + (int)uVar17;
              }
              else {
                sVar5 = psVar2[uVar9 + uVar17];
              }
              if ((uVar7 >> (uVar17 & 0x3f) & 1) == 0) {
LAB_00446e0e:
                uVar12 = 0;
              }
              else {
                lVar10 = (long)rdata->days + rdata->micros / 86400000000;
                lVar15 = lVar10 % 0x1e;
                lVar16 = (long)rdata->months + lVar10 / 0x1e;
                lVar11 = (long)*(int32_t *)((long)piVar4 + -4) + *piVar4 / 86400000000;
                lVar10 = lVar11 % 0x1e;
                lVar11 = (long)((interval_t *)(piVar4 + -1))->months + lVar11 / 0x1e;
                if (lVar11 < lVar16) {
                  uVar12 = 0;
                }
                else {
                  uVar12 = 1;
                  if (lVar11 <= lVar16) {
                    if (lVar10 < lVar15) goto LAB_00446e0e;
                    uVar12 = (ulong)(rdata->micros % 86400000000 <= *piVar4 % 86400000000 ||
                                    lVar15 < lVar10);
                  }
                }
              }
              psVar3[iVar13] = sVar5;
              iVar13 = uVar12 + iVar13;
              uVar17 = uVar17 + 1;
              piVar4 = piVar4 + 2;
              uVar12 = uVar6;
            } while (uVar6 - uVar9 != uVar17);
          }
        }
      }
      uVar8 = uVar8 + 1;
      uVar9 = uVar12;
    } while (uVar8 != count + 0x3f >> 6);
  }
  return iVar13;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}